

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void lowbd_fwd_txfm2d_32x32_avx2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte in_CL;
  __m256i *buf;
  int i_1;
  int i;
  int lr_flip;
  int ud_flip;
  transform_1d_avx2_conflict1 row_txfm;
  transform_1d_avx2_conflict1 col_txfm;
  int height;
  int width;
  int cos_bit_row;
  int cos_bit_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m256i buf1 [128];
  __m256i buf0 [32];
  TX_SIZE tx_size;
  int in_stack_ffffffffffffeb40;
  int in_stack_ffffffffffffeb44;
  __m256i *in_stack_ffffffffffffeb48;
  undefined4 in_stack_ffffffffffffeb50;
  int in_stack_ffffffffffffeb54;
  int16_t *in_stack_ffffffffffffeb58;
  __m256i *out;
  int local_14a0;
  int local_149c;
  int local_1498;
  int local_1494;
  transform_1d_avx2_conflict1 local_1490;
  transform_1d_avx2_conflict1 local_1488;
  int size;
  longlong local_1460 [51];
  __m256i *in_stack_ffffffffffffed38;
  __m256i *in_stack_ffffffffffffed40;
  longlong local_460 [130];
  undefined1 local_4d;
  byte local_45;
  
  local_4d = 3;
  local_45 = in_CL;
  iVar1 = get_txw_idx('\x03');
  iVar2 = get_txh_idx('\x03');
  iVar3 = (int)av1_fwd_cos_bit_col[iVar1][iVar2];
  iVar1 = (int)av1_fwd_cos_bit_row[iVar1][iVar2];
  size = 0x20;
  iVar2 = 0x20;
  local_1488 = col_txfm16x32_arr[local_45];
  local_1490 = row_txfm16x32_arr[local_45];
  get_flip_cfg(local_45,&local_1494,&local_1498);
  for (local_149c = 0; local_149c < 2; local_149c = local_149c + 1) {
    if (local_1494 == 0) {
      load_buffer_16bit_to_16bit_avx2
                (in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb48,
                 in_stack_ffffffffffffeb44);
    }
    else {
      load_buffer_16bit_to_16bit_flip_avx2
                (in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb48,
                 in_stack_ffffffffffffeb44);
    }
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    (*local_1488)((__m256i *)local_460,(__m256i *)local_460,(int8_t)iVar3);
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    transpose_16bit_16x16_avx2(in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
    transpose_16bit_16x16_avx2(in_stack_ffffffffffffed40,in_stack_ffffffffffffed38);
  }
  for (local_14a0 = 0; local_14a0 < 2; local_14a0 = local_14a0 + 1) {
    if (local_1498 == 0) {
      out = (__m256i *)(local_1460 + (long)(local_14a0 << 5) * 4);
    }
    else {
      out = (__m256i *)local_460;
      flip_buf_avx2((__m256i *)(local_1460 + (long)(local_14a0 << 5) * 4),out,0x20);
    }
    (*local_1490)(out,out,(int8_t)iVar1);
    round_shift_16bit_w16_avx2((__m256i *)CONCAT44(iVar3,iVar1),size,iVar2);
    store_buffer_16bit_to_32bit_w16_avx2
              ((__m256i *)CONCAT44(in_stack_ffffffffffffeb54,in_stack_ffffffffffffeb50),
               (int32_t *)in_stack_ffffffffffffeb48,in_stack_ffffffffffffeb44,
               in_stack_ffffffffffffeb40);
  }
  return;
}

Assistant:

static void lowbd_fwd_txfm2d_32x32_avx2(const int16_t *input, int32_t *output,
                                        int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  const TX_SIZE tx_size = TX_32X32;
  __m256i buf0[32], buf1[128];
  const int8_t *shift = av1_fwd_txfm_shift_ls[tx_size];
  const int txw_idx = get_txw_idx(tx_size);
  const int txh_idx = get_txh_idx(tx_size);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = tx_size_wide[tx_size];
  const int height = tx_size_high[tx_size];
  const transform_1d_avx2 col_txfm = col_txfm16x32_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_txfm16x32_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  for (int i = 0; i < 2; i++) {
    if (ud_flip) {
      load_buffer_16bit_to_16bit_flip_avx2(input + 16 * i, stride, buf0,
                                           height);
    } else {
      load_buffer_16bit_to_16bit_avx2(input + 16 * i, stride, buf0, height);
    }
    round_shift_16bit_w16_avx2(buf0, height, shift[0]);
    col_txfm(buf0, buf0, cos_bit_col);
    round_shift_16bit_w16_avx2(buf0, height, shift[1]);
    transpose_16bit_16x16_avx2(buf0 + 0 * 16, buf1 + 0 * width + 16 * i);
    transpose_16bit_16x16_avx2(buf0 + 1 * 16, buf1 + 1 * width + 16 * i);
  }

  for (int i = 0; i < 2; i++) {
    __m256i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_avx2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit_w16_avx2(buf, width, shift[2]);
    store_buffer_16bit_to_32bit_w16_avx2(buf, output + i * 16, height, width);
  }
}